

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRegexp.c
# Opt level: O3

int main(int argc,char **argv)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  size_t sVar6;
  xmlRegexpPtr comp;
  undefined8 *puVar7;
  ulong uVar8;
  int iVar9;
  char *pattern;
  char *value;
  undefined8 local_13c0;
  char local_13b8 [5000];
  
  xmlInitMemory();
  if (argc < 2) {
    usage(*argv);
    iVar9 = 1;
  }
  else {
    iVar9 = 1;
    local_13c0 = (char *)0x0;
    do {
      pcVar5 = argv[iVar9];
      if (*pcVar5 == '-') {
        if ((pcVar5[1] == '\0') || ((pcVar5[1] == '-' && (pcVar5[2] == '\0')))) break;
        iVar3 = strcmp(pcVar5,"-debug");
        if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--debug"), iVar3 == 0)) {
          debug = debug + 1;
        }
        else {
          iVar3 = strcmp(pcVar5,"-repeat");
          if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--repeat"), iVar3 == 0)) {
            repeat = repeat + 1;
          }
          else if ((((pcVar5[1] == 'i') && (pcVar5[2] == '\0')) ||
                   ((pcVar5[1] == 'f' && (pcVar5[2] == '\0')))) ||
                  (iVar3 = strcmp(pcVar5,"--input"), iVar3 == 0)) {
            local_13c0 = argv[(long)iVar9 + 1];
            iVar9 = iVar9 + 1;
          }
          else {
            main_cold_1();
          }
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < argc);
    pcVar5 = local_13c0;
    if (local_13c0 == (char *)0x0) {
      uVar8 = 1;
      local_13c0 = (char *)0x0;
      comp = (xmlRegexpPtr)0x0;
      pcVar5 = (char *)0x0;
      do {
        value = argv[uVar8];
        if (*value == '-') {
          if ((value[1] == '-') && (value[2] == '\0')) {
            local_13c0 = (char *)CONCAT44(local_13c0._4_4_,1);
            value = pcVar5;
          }
          else {
            if ((int)local_13c0 == 1 || value[1] == '\0') goto LAB_001015b6;
            local_13c0 = (char *)((ulong)local_13c0._4_4_ << 0x20);
            value = pcVar5;
          }
        }
        else {
LAB_001015b6:
          if (pcVar5 == (char *)0x0) {
            printf("Testing %s:\n",value);
            comp = (xmlRegexpPtr)xmlRegexpCompile(value);
            if (comp == (xmlRegexpPtr)0x0) {
              puts("   failed to compile");
              goto LAB_00101662;
            }
            if (debug != 0) {
              xmlRegexpPrint(_stdout,comp);
            }
          }
          else {
            testRegexp(comp,value);
            value = pcVar5;
          }
        }
        uVar8 = uVar8 + 1;
        pcVar5 = value;
      } while ((uint)argc != uVar8);
joined_r0x0010162a:
      if (comp != (xmlRegexpPtr)0x0) {
        xmlRegFreeRegexp(comp);
      }
    }
    else {
      __stream = fopen64(local_13c0,"r");
      if (__stream != (FILE *)0x0) {
        comp = (xmlRegexpPtr)0x0;
LAB_0010146c:
        do {
          pcVar5 = fgets(local_13b8,0x1194,__stream);
          if (pcVar5 == (char *)0x0) {
            fclose(__stream);
            goto joined_r0x0010162a;
          }
          sVar6 = strlen(local_13b8);
          uVar4 = (uint)sVar6;
          if (0 < (int)uVar4) {
            uVar8 = (ulong)(uVar4 & 0x7fffffff);
            do {
              if ((0x20 < (ulong)(byte)local_13b8[uVar8 - 1]) ||
                 ((0x100002600U >> ((ulong)(byte)local_13b8[uVar8 - 1] & 0x3f) & 1) == 0)) {
                local_13b8[uVar8 & 0xffffffff] = '\0';
                if (local_13b8[0] == '#') goto LAB_0010146c;
                if ((local_13b8[0] == '=') && (local_13b8[1] == '>')) {
                  if (comp != (xmlRegexpPtr)0x0) {
                    xmlRegFreeRegexp(comp);
                  }
                  printf("Regexp: %s\n",local_13b8 + 2);
                  pcVar5 = local_13b8 + 2;
                }
                else {
                  if (comp != (xmlRegexpPtr)0x0) {
                    testRegexp(comp,local_13b8);
                    goto LAB_0010146c;
                  }
                  printf("Regexp: %s\n",local_13b8);
                  pcVar5 = local_13b8;
                }
                comp = (xmlRegexpPtr)xmlRegexpCompile(pcVar5);
                if (comp != (xmlRegexpPtr)0x0) goto LAB_0010146c;
                puts("   failed to compile");
                fclose(__stream);
                goto LAB_00101662;
              }
              bVar2 = 1 < uVar8;
              uVar8 = uVar8 - 1;
            } while (bVar2);
            uVar4 = -(uint)((ulong)(uVar4 & 0x7fffffff) == 0);
          }
          local_13b8[(int)uVar4] = '\0';
        } while( true );
      }
      puVar7 = (undefined8 *)__xmlGenericError();
      pcVar1 = (code *)*puVar7;
      puVar7 = (undefined8 *)__xmlGenericErrorContext();
      (*pcVar1)(*puVar7,"Cannot open %s for reading\n",pcVar5);
    }
LAB_00101662:
    xmlCleanupParser();
    xmlMemoryDump();
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int main(int argc, char **argv) {
    xmlRegexpPtr comp = NULL;
#ifdef LIBXML_EXPR_ENABLED
    xmlExpNodePtr expr = NULL;
    int use_exp = 0;
    xmlExpCtxtPtr ctxt = NULL;
#endif
    const char *pattern = NULL;
    char *filename = NULL;
    int i;

    xmlInitMemory();

    if (argc <= 1) {
	usage(argv[0]);
	return(1);
    }
    for (i = 1; i < argc ; i++) {
	if (!strcmp(argv[i], "-"))
	    break;

	if (argv[i][0] != '-')
	    continue;
	if (!strcmp(argv[i], "--"))
	    break;

	if ((!strcmp(argv[i], "-debug")) || (!strcmp(argv[i], "--debug"))) {
	    debug++;
	} else if ((!strcmp(argv[i], "-repeat")) ||
	         (!strcmp(argv[i], "--repeat"))) {
	    repeat++;
#ifdef LIBXML_EXPR_ENABLED
	} else if ((!strcmp(argv[i], "-expr")) ||
	         (!strcmp(argv[i], "--expr"))) {
	    use_exp++;
#endif
	} else if ((!strcmp(argv[i], "-i")) || (!strcmp(argv[i], "-f")) ||
		   (!strcmp(argv[i], "--input")))
	    filename = argv[++i];
        else {
	    fprintf(stderr, "Unknown option %s\n", argv[i]);
	    usage(argv[0]);
	}
    }

#ifdef LIBXML_EXPR_ENABLED
    if (use_exp)
	ctxt = xmlExpNewCtxt(0, NULL);
#endif

    if (filename != NULL) {
#ifdef LIBXML_EXPR_ENABLED
        if (use_exp)
	    runFileTest(ctxt, filename);
	else
#endif
	    testRegexpFile(filename);
    } else {
        int  data = 0;
#ifdef LIBXML_EXPR_ENABLED

        if (use_exp) {
	    for (i = 1; i < argc ; i++) {
	        if (strcmp(argv[i], "--") == 0)
		    data = 1;
		else if ((argv[i][0] != '-') || (strcmp(argv[i], "-") == 0) ||
		    (data == 1)) {
		    if (pattern == NULL) {
			pattern = argv[i];
			printf("Testing expr %s:\n", pattern);
			expr = xmlExpParse(ctxt, pattern);
			if (expr == NULL) {
			    printf("   failed to compile\n");
			    break;
			}
			if (debug) {
			    exprDebug(ctxt, expr);
			}
		    } else {
			testReduce(ctxt, expr, argv[i]);
		    }
		}
	    }
	    if (expr != NULL) {
		xmlExpFree(ctxt, expr);
		expr = NULL;
	    }
	} else
#endif
        {
	    for (i = 1; i < argc ; i++) {
	        if (strcmp(argv[i], "--") == 0)
		    data = 1;
		else if ((argv[i][0] != '-') || (strcmp(argv[i], "-") == 0) ||
		         (data == 1)) {
		    if (pattern == NULL) {
			pattern = argv[i];
			printf("Testing %s:\n", pattern);
			comp = xmlRegexpCompile((const xmlChar *) pattern);
			if (comp == NULL) {
			    printf("   failed to compile\n");
			    break;
			}
			if (debug)
			    xmlRegexpPrint(stdout, comp);
		    } else {
			testRegexp(comp, argv[i]);
		    }
		}
	    }
	    if (comp != NULL)
		xmlRegFreeRegexp(comp);
        }
    }
#ifdef LIBXML_EXPR_ENABLED
    if (ctxt != NULL) {
	printf("Ops: %d nodes, %d cons\n",
	       xmlExpCtxtNbNodes(ctxt), xmlExpCtxtNbCons(ctxt));
	xmlExpFreeCtxt(ctxt);
    }
#endif
    xmlCleanupParser();
    xmlMemoryDump();
    return(0);
}